

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CampaignData.cpp
# Opt level: O3

int adios2::core::engine::sqlcb_host(void *p,int argc,char **argv,char **azColName)

{
  CampaignHost ch;
  allocator local_a1;
  undefined1 *local_a0 [2];
  undefined1 local_90 [16];
  undefined1 local_80 [32];
  _Alloc_hider local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  pointer local_40;
  pointer puStack_38;
  pointer local_30;
  
  local_80._8_8_ = 0;
  local_80[0x10] = '\0';
  local_58 = 0;
  local_50._M_local_buf[0] = '\0';
  local_40 = (pointer)0x0;
  puStack_38 = (pointer)0x0;
  local_30 = (pointer)0x0;
  local_80._0_8_ = local_80 + 0x10;
  local_60._M_p = (pointer)&local_50;
  std::__cxx11::string::string((string *)local_a0,*argv,&local_a1);
  std::__cxx11::string::operator=((string *)local_80,(string *)local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  std::__cxx11::string::string((string *)local_a0,argv[1],&local_a1);
  std::__cxx11::string::operator=((string *)&local_60,(string *)local_a0);
  if (local_a0[0] != local_90) {
    operator_delete(local_a0[0]);
  }
  std::
  vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>::
  push_back((vector<adios2::core::engine::CampaignHost,_std::allocator<adios2::core::engine::CampaignHost>_>
             *)((long)p + 0x38),(value_type *)local_80);
  if (local_40 != (pointer)0x0) {
    operator_delete(local_40);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_p != &local_50) {
    operator_delete(local_60._M_p);
  }
  if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
    operator_delete((void *)local_80._0_8_);
  }
  return 0;
}

Assistant:

static int sqlcb_host(void *p, int argc, char **argv, char **azColName)
{
    CampaignData *cdp = reinterpret_cast<CampaignData *>(p);
    CampaignHost ch;
    /*
    std::cout << "SQL: host record: ";
    for (int i = 0; i < argc; i++)
    {
        std::cout << azColName[i] << " = " << (argv[i] ? argv[i] : "NULL")
                  << std::endl;
    }
    std::cout << std::endl;
    */
    ch.hostname = std::string(argv[0]);
    ch.longhostname = std::string(argv[1]);
    cdp->hosts.push_back(ch);
    return 0;
}